

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O1

interval_t
duckdb::DateTruncBinaryOperator::Operation<duckdb::string_t,duckdb::interval_t,duckdb::interval_t>
          (string_t specifier,interval_t date)

{
  DatePartSpecifier DVar1;
  NotImplementedException *this;
  int iVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  interval_t iVar6;
  string local_78;
  string local_58;
  undefined8 local_38;
  long local_30;
  
  lVar5 = date.micros;
  uVar3 = date._0_8_;
  local_30 = specifier.value._8_8_;
  local_38 = specifier.value._0_8_;
  lVar4 = local_30;
  if ((local_38 & 0xffffffff) < 0xd) {
    lVar4 = (long)&local_38 + 4;
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,lVar4,(local_38 & 0xffffffff) + lVar4);
  DVar1 = GetDatePartSpecifier(&local_78);
  if (JULIAN_DAY < DVar1) {
switchD_01b76265_caseD_12:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Specifier type not implemented for DATETRUNC","");
    NotImplementedException::NotImplementedException(this,&local_58);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar2 = date.months;
  switch(DVar1) {
  case BEGIN_BIGINT:
  case ISOYEAR:
    iVar2 = (((uint)(iVar2 / 6 + (iVar2 >> 0x1f)) >> 1) - (iVar2 >> 0x1f)) * 4;
    goto LAB_01b76325;
  case MONTH:
    uVar3 = uVar3 & 0xffffffff;
    break;
  case DECADE:
    uVar3 = (ulong)(uint)((iVar2 / 0x78) * 0x78);
    break;
  case CENTURY:
    uVar3 = (ulong)(uint)((iVar2 / 0x4b0) * 0x4b0);
    break;
  case MILLENNIUM:
    uVar3 = (ulong)(uint)((iVar2 / 12000) * 12000);
    break;
  case MICROSECONDS:
    goto switchD_01b76265_caseD_6;
  case MILLISECONDS:
    lVar5 = (lVar5 / 1000) * 1000;
    goto switchD_01b76265_caseD_6;
  case SECOND:
  case BEGIN_DOUBLE:
    lVar5 = (lVar5 / 1000000) * 1000000;
    goto switchD_01b76265_caseD_6;
  case MINUTE:
    lVar5 = (lVar5 / 60000000) * 60000000;
    goto switchD_01b76265_caseD_6;
  case HOUR:
    lVar5 = (lVar5 / 3600000000) * 3600000000;
    goto switchD_01b76265_caseD_6;
  case WEEK:
  case YEARWEEK:
    iVar2 = (int)((ulong)(((long)uVar3 >> 0x20) * -0x6db6db6d) >> 0x20) + date.days;
    uVar3 = uVar3 & 0xffffffff | (ulong)(uint)(((iVar2 >> 2) - (iVar2 >> 0x1f)) * 7) << 0x20;
    break;
  case QUARTER:
    iVar2 = iVar2 / 3;
LAB_01b76325:
    uVar3 = (ulong)(uint)(iVar2 * 3);
    break;
  case ERA:
  case TIMEZONE:
  case TIMEZONE_HOUR:
  case TIMEZONE_MINUTE:
    goto switchD_01b76265_caseD_12;
  }
  lVar5 = 0;
switchD_01b76265_caseD_6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  iVar6.micros = lVar5;
  iVar6.months = (int)uVar3;
  iVar6.days = (int)(uVar3 >> 0x20);
  return iVar6;
}

Assistant:

static inline TR Operation(TA specifier, TB date) {
		return TruncateElement<TB, TR>(GetDatePartSpecifier(specifier.GetString()), date);
	}